

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

string * gimage::getNewImageName(string *__return_storage_ptr__,string *prefix)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  ImageIO *pIVar4;
  size_type sVar5;
  ostream *poVar6;
  uint uVar7;
  string suffix;
  char *local_3d0 [4];
  ifstream file;
  ostringstream out;
  
  suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
  suffix._M_string_length = 0;
  suffix.field_2._M_local_buf[0] = '\0';
  lVar3 = std::__cxx11::string::rfind((char)prefix,0x2e);
  if ((lVar3 != -1) && (prefix->_M_string_length - lVar3 < 5)) {
    std::__cxx11::string::substr((ulong)&file,(ulong)prefix);
    std::__cxx11::string::operator=((string *)&suffix,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::substr((ulong)&file,(ulong)prefix);
    std::__cxx11::string::operator=((string *)prefix,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
  }
  if (suffix._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&suffix);
    pIVar4 = getImageIO();
    bVar1 = ImageIO::handlesFile(pIVar4,"file.png",false);
    if (!bVar1) {
      pIVar4 = getImageIO();
      bVar1 = ImageIO::handlesFile(pIVar4,"file.tif",false);
      if (!bVar1) goto LAB_0012f8e0;
    }
    std::__cxx11::string::assign((char *)&suffix);
  }
LAB_0012f8e0:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar5 = 0;
  for (uVar7 = 0; (sVar5 == 0 && (uVar7 < 1000)); uVar7 = uVar7 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
    poVar6 = std::operator<<((ostream *)&out,(string *)prefix);
    std::operator<<(poVar6,"_");
    if ((uVar7 < 100) && (std::operator<<((ostream *)&out,"0"), uVar7 < 10)) {
      std::operator<<((ostream *)&out,"0");
    }
    poVar6 = (ostream *)std::ostream::operator<<((ostringstream *)&out,uVar7);
    std::operator<<(poVar6,(string *)&suffix);
    std::__cxx11::stringbuf::str();
    std::ifstream::ifstream(&file,local_3d0[0],_S_in);
    std::__cxx11::string::~string((string *)local_3d0);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_3d0);
      std::__cxx11::string::~string((string *)local_3d0);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&file);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
    sVar5 = __return_storage_ptr__->_M_string_length;
  }
  std::__cxx11::string::~string((string *)&suffix);
  return __return_storage_ptr__;
}

Assistant:

std::string getNewImageName(std::string prefix)
{
  // try getting existing suffix

  std::string suffix;

  size_t i=prefix.rfind('.');

  if (i != prefix.npos && prefix.size()-i <= 4)
  {
    suffix=prefix.substr(i);
    prefix=prefix.substr(0, i);
  }

  // determine supported format for writing image

  if (suffix.size() == 0)
  {
    suffix=".ppm";

    if (getImageIO().handlesFile("file.png", false))
    {
      suffix=".png";
    }
    else if (getImageIO().handlesFile("file.tif", false))
    {
      suffix=".tif";
    }
  }

  // find file name that is not used

  int c=0;
  std::string name;

  while (name.size() == 0 && c < 1000)
  {
    std::ostringstream out;
    out << prefix << "_";

    if (c < 100)
    {
      out << "0";
    }

    if (c < 10)
    {
      out << "0";
    }

    out << c++ << suffix;

    std::ifstream file(out.str().c_str());

    if (!file.is_open())
    {
      name=out.str();
    }

    file.close();
  }

  return name;
}